

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_terrain.cxx
# Opt level: O1

void __thiscall level_mesh::separate_terrain(level_mesh *this,uint16_t texture)

{
  pointer *ppbVar1;
  pointer *pppbVar2;
  pointer pbVar3;
  iterator __position;
  iterator __position_00;
  uint16_t uVar4;
  uint16_t uVar5;
  pointer pbVar6;
  long lVar7;
  uint16_t uVar8;
  b_model_instance *pbVar9;
  b_model_instance *pbVar10;
  bool bVar11;
  byte bVar12;
  b_model_instance *instance;
  b_model_instance temp;
  b_model local_a0;
  b_model_instance *local_90;
  b_model_instance local_88;
  
  bVar12 = 0;
  b_model_instance::b_model_instance(&local_88,this->m_free_tag,0xffff);
  pbVar6 = (this->super_xr_mesh_builder).m_faces.
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->super_xr_mesh_builder).m_faces.
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = local_88.sector;
  do {
    if (pbVar6 == pbVar3) {
      if (local_88.sector != 0xffff) {
        local_90 = (b_model_instance *)operator_new(0x78);
        pbVar9 = &local_88;
        pbVar10 = local_90;
        for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
          uVar4 = pbVar9->model_id;
          uVar8 = pbVar9->sector;
          pbVar10->tag = pbVar9->tag;
          pbVar10->model_id = uVar4;
          pbVar10->sector = uVar8;
          pbVar9 = (b_model_instance *)((long)pbVar9 + ((ulong)bVar12 * -2 + 1) * 8);
          pbVar10 = (b_model_instance *)((long)pbVar10 + (ulong)bVar12 * -0x10 + 8);
        }
        local_a0.field_3.m_instances =
             (b_model_instance **)
             ((long)(this->m_instances).
                    super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_instances).
                    super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3);
        local_a0.m_type = MT_TERRAIN;
        local_a0.m_locked = false;
        local_a0.m_num_instances = 1;
        __position._M_current =
             (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<b_model,_std::allocator<b_model>_>::_M_realloc_insert<b_model>
                    (&this->m_models,__position,&local_a0);
        }
        else {
          (__position._M_current)->m_type = (int)2;
          (__position._M_current)->m_locked = (bool)(char)(2 >> 0x20);
          (__position._M_current)->field_0x5 = local_a0._5_1_;
          (__position._M_current)->m_num_instances = 1;
          ((__position._M_current)->field_3).m_instances = (b_model_instance **)local_a0.field_3;
          ppbVar1 = &(this->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppbVar1 = *ppbVar1 + 1;
        }
        __position_00._M_current =
             (this->m_instances).
             super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->m_instances).
            super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<b_model_instance*,std::allocator<b_model_instance*>>::
          _M_realloc_insert<b_model_instance*const&>
                    ((vector<b_model_instance*,std::allocator<b_model_instance*>> *)
                     &this->m_instances,__position_00,&local_90);
        }
        else {
          *__position_00._M_current = local_90;
          pppbVar2 = &(this->m_instances).
                      super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppbVar2 = *pppbVar2 + 1;
        }
        this->m_free_tag = this->m_free_tag + 1;
      }
      return;
    }
    uVar8 = uVar4;
    uVar5 = local_88.sector;
    if ((*(uint16_t *)&pbVar6->field_1 == texture) && (pbVar6->tag == 0xffffffff)) {
      pbVar6->tag = local_88.tag;
      uVar8 = pbVar6->sector;
      uVar5 = uVar8;
      if ((uVar4 != 0xffff) &&
         (bVar11 = uVar4 != uVar8, uVar8 = uVar4, uVar5 = local_88.sector, bVar11)) {
        __assert_fail("temp.sector == it->sector",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_terrain.cxx"
                      ,0x84,"void level_mesh::separate_terrain(uint16_t)");
      }
    }
    local_88.sector = uVar5;
    pbVar6 = pbVar6 + 1;
    uVar4 = uVar8;
  } while( true );
}

Assistant:

void level_mesh::separate_terrain(uint16_t texture)
{
	b_model_instance temp(m_free_tag, UINT16_MAX);
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		if (it->surface.texture != texture || it->tag != BAD_IDX)
			continue;
		it->tag = temp.tag;
		if (temp.sector == UINT16_MAX)
			temp.sector = it->sector;
		else
			xr_assert(temp.sector == it->sector);
	}
	if (temp.sector != UINT16_MAX) {
		b_model_instance* instance = new b_model_instance(temp);
		m_models.push_back(b_model(b_model::MT_TERRAIN, m_instances.size()));
		m_instances.push_back(instance);
		++m_free_tag;
	}
}